

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O3

int AF_A_RestoreSpecialThing1
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  uint uVar7;
  AInventory *this;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0061276f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AInventory *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AInventory *)0x0) {
LAB_00612659:
        this = (AInventory *)0x0;
        pVVar8 = param;
        uVar7 = numparam;
      }
      else {
        pPVar6 = (this->super_AActor).super_DThinker.super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (this->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
        }
        bVar9 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar6 == pPVar4;
        if (!bVar10 && !bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar7 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0061276f;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_00612711;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0061275f;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar3[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar8,uVar7,ret);
              puVar3[1] = pPVar6;
            }
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar4 && bVar9) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar9 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar4) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0061276f;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_0061275f;
      }
      if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00612711:
        pbVar1 = (byte *)((long)&(this->super_AActor).renderflags.Value + 1);
        *pbVar1 = *pbVar1 & 0x7f;
        AInventory::DoRespawn(this);
        local_2c.ID = S_FindSound("misc/spawn");
        S_Sound(&this->super_AActor,2,&local_2c,1.0,1.001);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0061276f;
    }
    if (this == (AInventory *)0x0) goto LAB_00612659;
  }
LAB_0061275f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0061276f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_pickups.cpp"
                ,0x15e,
                "int AF_A_RestoreSpecialThing1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RestoreSpecialThing1)
{
	PARAM_ACTION_PROLOGUE;

	self->renderflags &= ~RF_INVISIBLE;
	if (static_cast<AInventory *>(self)->DoRespawn ())
	{
		S_Sound (self, CHAN_VOICE, "misc/spawn", 1, ATTN_IDLE);
	}
	return 0;
}